

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_BaseModel.cpp
# Opt level: O2

bool __thiscall Opcode::BaseModel::CreateTree(BaseModel *this,bool no_leaf,bool quantized)

{
  AABBQuantizedNoLeafTree *this_00;
  
  if (this->mTree != (AABBOptimizedTree *)0x0) {
    (*this->mTree->_vptr_AABBOptimizedTree[1])();
    this->mTree = (AABBOptimizedTree *)0x0;
  }
  this->mModelCode = (this->mModelCode & 0xfffffffc) + (uint)no_leaf * 2 | (uint)quantized;
  if (no_leaf) {
    if (quantized) {
      this_00 = (AABBQuantizedNoLeafTree *)operator_new(0x30);
      AABBQuantizedNoLeafTree::AABBQuantizedNoLeafTree(this_00);
    }
    else {
      this_00 = (AABBQuantizedNoLeafTree *)operator_new(0x18);
      AABBNoLeafTree::AABBNoLeafTree((AABBNoLeafTree *)this_00);
    }
  }
  else if (quantized) {
    this_00 = (AABBQuantizedNoLeafTree *)operator_new(0x30);
    AABBQuantizedTree::AABBQuantizedTree((AABBQuantizedTree *)this_00);
  }
  else {
    this_00 = (AABBQuantizedNoLeafTree *)operator_new(0x18);
    AABBCollisionTree::AABBCollisionTree((AABBCollisionTree *)this_00);
  }
  this->mTree = &this_00->super_AABBOptimizedTree;
  return true;
}

Assistant:

bool BaseModel::CreateTree(bool no_leaf, bool quantized)
{
	DELETESINGLE(mTree);

	// Setup model code
	if(no_leaf)		mModelCode |= OPC_NO_LEAF;
	else			mModelCode &= ~OPC_NO_LEAF;

	if(quantized)	mModelCode |= OPC_QUANTIZED;
	else			mModelCode &= ~OPC_QUANTIZED;

	// Create the correct class
	if(mModelCode & OPC_NO_LEAF)
	{
		if(mModelCode & OPC_QUANTIZED)	mTree = new AABBQuantizedNoLeafTree;
		else							mTree = new AABBNoLeafTree;
	}
	else
	{
		if(mModelCode & OPC_QUANTIZED)	mTree = new AABBQuantizedTree;
		else							mTree = new AABBCollisionTree;
	}
	CHECKALLOC(mTree);

	return true;
}